

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

intptr_t sysbvm_methodDictionary_scanFor(sysbvm_tuple_t dictionary,sysbvm_tuple_t element)

{
  ulong uVar1;
  size_t i;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  sysbvm_tuple_t *psVar6;
  
  uVar1 = 0xffffffffffffffff;
  uVar3 = uVar1;
  if ((((dictionary & 0xf) == 0 && dictionary != 0) &&
      (uVar5 = *(ulong *)(dictionary + 0x18), (uVar5 & 0xf) == 0 && uVar5 != 0)) &&
     (0xf < *(uint *)(uVar5 + 0xc))) {
    uVar4 = (ulong)(*(uint *)(uVar5 + 0xc) >> 4);
    sVar2 = sysbvm_tuple_identityHash(element);
    psVar6 = (sysbvm_tuple_t *)(uVar5 + 0x10);
    uVar5 = sVar2 % uVar4;
    for (uVar3 = uVar5; uVar3 < uVar4; uVar3 = uVar3 + 1) {
      if (psVar6[uVar3 * 2] == 0x3f) {
        return uVar3;
      }
      if (psVar6[uVar3 * 2] == element) {
        return uVar3;
      }
    }
    uVar4 = 0;
    for (; ((uVar3 = uVar1, uVar4 < uVar5 && (uVar3 = uVar4, *psVar6 != 0x3f)) &&
           (*psVar6 != element)); psVar6 = psVar6 + 2) {
      uVar4 = uVar4 + 1;
    }
  }
  return uVar3;
}

Assistant:

static intptr_t sysbvm_methodDictionary_scanFor(sysbvm_tuple_t dictionary, sysbvm_tuple_t element)
{
    if(!sysbvm_tuple_isNonNullPointer(dictionary))
        return -1;

    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    size_t capacity = sysbvm_tuple_getSizeInSlots(dictionaryObject->storage) / 2;
    if(capacity == 0)
        return -1;

    sysbvm_array_t *storage = (sysbvm_array_t*)dictionaryObject->storage;
    size_t hashIndex = sysbvm_tuple_identityHash(element) % capacity;
    for(size_t i = hashIndex; i < capacity; ++i)
    {
        sysbvm_tuple_t dictionaryKey = storage->elements[i*2];
        if(dictionaryKey == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE || sysbvm_tuple_identityEquals(element, dictionaryKey))
            return (intptr_t)i;
    }

    for(size_t i = 0; i < hashIndex; ++i)
    {
        sysbvm_tuple_t dictionaryKey = storage->elements[i*2];
        if(dictionaryKey == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE || sysbvm_tuple_identityEquals(element, dictionaryKey))
            return (intptr_t)i;
    }

    return -1;
}